

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O0

int test_xmlCreatePushParserCtxt(void)

{
  int iVar1;
  int iVar2;
  xmlSAXHandlerPtr val;
  void *val_00;
  char *val_01;
  char *val_02;
  xmlParserCtxtPtr val_03;
  int local_5c;
  int n_filename;
  char *filename;
  int local_48;
  int n_size;
  int size;
  int n_chunk;
  char *chunk;
  int n_user_data;
  void *user_data;
  int n_sax;
  xmlSAXHandlerPtr sax;
  xmlParserCtxtPtr ret_val;
  int mem_base;
  int test_ret;
  
  ret_val._4_4_ = 0;
  for (user_data._4_4_ = 0; (int)user_data._4_4_ < 2; user_data._4_4_ = user_data._4_4_ + 1) {
    for (chunk._4_4_ = 0; (int)chunk._4_4_ < 3; chunk._4_4_ = chunk._4_4_ + 1) {
      for (n_size = 0; n_size < 4; n_size = n_size + 1) {
        for (filename._4_4_ = 0; (int)filename._4_4_ < 4; filename._4_4_ = filename._4_4_ + 1) {
          for (local_5c = 0; local_5c < 6; local_5c = local_5c + 1) {
            iVar1 = xmlMemBlocks();
            val = gen_xmlSAXHandlerPtr(user_data._4_4_,0);
            val_00 = gen_userdata(chunk._4_4_,1);
            val_01 = gen_const_char_ptr(n_size,2);
            local_48 = gen_int(filename._4_4_,3);
            val_02 = gen_fileoutput(local_5c,4);
            if (val_01 != (char *)0x0) {
              iVar2 = xmlStrlen(val_01);
              if (iVar2 < local_48) {
                local_48 = 0;
              }
            }
            val_03 = (xmlParserCtxtPtr)xmlCreatePushParserCtxt(val,val_00,val_01,local_48,val_02);
            desret_xmlParserCtxtPtr(val_03);
            call_tests = call_tests + 1;
            des_xmlSAXHandlerPtr(user_data._4_4_,val,0);
            des_userdata(chunk._4_4_,val_00,1);
            des_const_char_ptr(n_size,val_01,2);
            des_int(filename._4_4_,local_48,3);
            des_fileoutput(local_5c,val_02,4);
            xmlResetLastError();
            iVar2 = xmlMemBlocks();
            if (iVar1 != iVar2) {
              iVar2 = xmlMemBlocks();
              printf("Leak of %d blocks found in xmlCreatePushParserCtxt",
                     (ulong)(uint)(iVar2 - iVar1));
              ret_val._4_4_ = ret_val._4_4_ + 1;
              printf(" %d",(ulong)user_data._4_4_);
              printf(" %d",(ulong)chunk._4_4_);
              printf(" %d",(ulong)(uint)n_size);
              printf(" %d",(ulong)filename._4_4_);
              printf(" %d");
              printf("\n");
            }
          }
        }
      }
    }
  }
  function_tests = function_tests + 1;
  return ret_val._4_4_;
}

Assistant:

static int
test_xmlCreatePushParserCtxt(void) {
    int test_ret = 0;

#if defined(LIBXML_PUSH_ENABLED)
    int mem_base;
    xmlParserCtxtPtr ret_val;
    xmlSAXHandlerPtr sax; /* a SAX handler (optional) */
    int n_sax;
    void * user_data; /* user data for SAX callbacks (optional) */
    int n_user_data;
    const char * chunk; /* initial chunk (optional, deprecated) */
    int n_chunk;
    int size; /* size of initial chunk in bytes */
    int n_size;
    const char * filename; /* file name or URI (optional) */
    int n_filename;

    for (n_sax = 0;n_sax < gen_nb_xmlSAXHandlerPtr;n_sax++) {
    for (n_user_data = 0;n_user_data < gen_nb_userdata;n_user_data++) {
    for (n_chunk = 0;n_chunk < gen_nb_const_char_ptr;n_chunk++) {
    for (n_size = 0;n_size < gen_nb_int;n_size++) {
    for (n_filename = 0;n_filename < gen_nb_fileoutput;n_filename++) {
        mem_base = xmlMemBlocks();
        sax = gen_xmlSAXHandlerPtr(n_sax, 0);
        user_data = gen_userdata(n_user_data, 1);
        chunk = gen_const_char_ptr(n_chunk, 2);
        size = gen_int(n_size, 3);
        filename = gen_fileoutput(n_filename, 4);
        if ((chunk != NULL) &&
            (size > xmlStrlen(BAD_CAST chunk)))
            size = 0;

        ret_val = xmlCreatePushParserCtxt(sax, user_data, chunk, size, filename);
        desret_xmlParserCtxtPtr(ret_val);
        call_tests++;
        des_xmlSAXHandlerPtr(n_sax, sax, 0);
        des_userdata(n_user_data, user_data, 1);
        des_const_char_ptr(n_chunk, chunk, 2);
        des_int(n_size, size, 3);
        des_fileoutput(n_filename, filename, 4);
        xmlResetLastError();
        if (mem_base != xmlMemBlocks()) {
            printf("Leak of %d blocks found in xmlCreatePushParserCtxt",
	           xmlMemBlocks() - mem_base);
	    test_ret++;
            printf(" %d", n_sax);
            printf(" %d", n_user_data);
            printf(" %d", n_chunk);
            printf(" %d", n_size);
            printf(" %d", n_filename);
            printf("\n");
        }
    }
    }
    }
    }
    }
    function_tests++;
#endif

    return(test_ret);
}